

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O1

int report(string *test,string *error,int columns)

{
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  bool bVar4;
  
  lVar1 = std::cerr;
  poVar3 = (ostream *)&std::cerr;
  *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 0x14;
  *(uint *)(__cxa_finalize + *(long *)(lVar1 + -0x18)) =
       *(uint *)(__cxa_finalize + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(test->_M_dataplus)._M_p,test->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  bVar4 = error->_M_string_length == 0;
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[ OK ]",6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[FAIL] ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(error->_M_dataplus)._M_p,error->_M_string_length);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return (uint)!bVar4;
}

Assistant:

static int
report(std::string test, std::string error, int columns = 20)
{
  std::cerr << std::setw(columns) << std::left << test << " ";
  if (error.empty()) {
    std::cerr << "[ OK ]" << std::endl;
    return 0;
  }
  else {
    std::cerr << "[FAIL] " << error << std::endl;
    return 1;
  }
}